

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  ImVec2 *rhs;
  ImVec2 IVar1;
  ImVec2 local_90 [2];
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 size;
  ImVec2 local_50;
  ImVec2 pos;
  ImFontAtlasCustomRect *r;
  ImVec2 *out_uv_fill_local;
  ImVec2 *out_uv_border_local;
  ImVec2 *out_size_local;
  ImVec2 *out_offset_local;
  ImGuiMouseCursor cursor_type_local;
  ImFontAtlas *this_local;
  
  if ((cursor_type < 0) || (7 < cursor_type)) {
    this_local._7_1_ = false;
  }
  else if ((this->Flags & 2U) == 0) {
    if (this->CustomRectIds[0] == -1) {
      __assert_fail("CustomRectIds[0] != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_draw.cpp"
                    ,0x6ea,
                    "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                   );
    }
    pos = (ImVec2)ImVector<ImFontAtlasCustomRect>::operator[]
                            (&this->CustomRects,this->CustomRectIds[0]);
    if (*(int *)pos != -0x80000000) {
      __assert_fail("r.ID == FONT_ATLAS_DEFAULT_TEX_DATA_ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_draw.cpp"
                    ,0x6ec,
                    "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                   );
    }
    ImVec2::ImVec2(&size,(float)*(unsigned_short *)((long)pos + 8),
                   (float)*(unsigned_short *)((long)pos + 10));
    local_50 = operator+(FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type],&size);
    local_60 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = local_60;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    rhs = &this->TexUvScale;
    local_68 = ::operator*(&local_50,rhs);
    *out_uv_border = local_68;
    local_78 = operator+(&local_50,&local_60);
    local_70 = ::operator*(&local_78,rhs);
    out_uv_border[1] = local_70;
    local_50.x = local_50.x + 109.0;
    local_80 = ::operator*(&local_50,rhs);
    *out_uv_fill = local_80;
    local_90[0] = operator+(&local_50,&local_60);
    IVar1 = ::operator*(local_90,rhs);
    out_uv_fill[1] = IVar1;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    IM_ASSERT(r.ID == FONT_ATLAS_DEFAULT_TEX_DATA_ID);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}